

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O3

void __thiscall SmallVector_Clear_Test::~SmallVector_Clear_Test(SmallVector_Clear_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (SmallVector, Clear) {
    // The two containers start out with different sizes; one uses the small
    // buffer, the other, large.
    pstore::small_vector<int> a (std::size_t{4});
    EXPECT_EQ (4U, a.size ());
    a.clear ();
    EXPECT_EQ (0U, a.size ());
}